

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QAbstractAnimation_*>::growAppend
          (QCommonArrayOps<QAbstractAnimation_*> *this,QAbstractAnimation **b,QAbstractAnimation **e
          )

{
  bool bVar1;
  QArrayDataPointer<QAbstractAnimation_*> *this_00;
  QCommonArrayOps<QAbstractAnimation_*> *in_RDX;
  QCommonArrayOps<QAbstractAnimation_*> *in_RSI;
  QAbstractAnimation **in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QArrayDataPointer<QAbstractAnimation_*> *in_stack_ffffffffffffffa0;
  QPodArrayOps<QAbstractAnimation_*> *in_stack_ffffffffffffffb0;
  GrowthPosition in_stack_ffffffffffffffbc;
  QAbstractAnimation **p;
  QArrayDataPointer<QAbstractAnimation_*> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    this_00 = (QArrayDataPointer<QAbstractAnimation_*> *)((long)in_RDX - (long)in_RSI >> 3);
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    p = in_RDI;
    QArrayDataPointer<QAbstractAnimation_*>::QArrayDataPointer(&local_28);
    bVar1 = q_points_into_range<QtPrivate::QCommonArrayOps<QAbstractAnimation*>,QAbstractAnimation*const*>
                      ((QAbstractAnimation ***)p,in_RDX);
    if (bVar1) {
      QArrayDataPointer<QAbstractAnimation_*>::detachAndGrow
                (this_00,in_stack_ffffffffffffffbc,(qsizetype)in_stack_ffffffffffffffb0,
                 (QAbstractAnimation ***)in_RDI,in_stack_ffffffffffffffa0);
    }
    else {
      QArrayDataPointer<QAbstractAnimation_*>::detachAndGrow
                (this_00,in_stack_ffffffffffffffbc,(qsizetype)in_stack_ffffffffffffffb0,
                 (QAbstractAnimation ***)in_RDI,in_stack_ffffffffffffffa0);
    }
    QPodArrayOps<QAbstractAnimation_*>::copyAppend
              (in_stack_ffffffffffffffb0,in_RDI,(QAbstractAnimation **)in_stack_ffffffffffffffa0);
    QArrayDataPointer<QAbstractAnimation_*>::~QArrayDataPointer(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }